

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_w32n_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  __m256i v;
  undefined1 auVar1 [32];
  void *in_RSI;
  void *a;
  long in_RDI;
  long in_R8;
  uint in_R9D;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *a_00;
  undefined1 auVar5 [16];
  undefined1 auVar4 [32];
  long in_stack_00000008;
  __m256i v_m1_b;
  __m256i v_m0_b;
  int c;
  __m256i v_maxval_b;
  undefined1 in_stack_fffffffffffffe40 [24];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_188;
  undefined4 local_124;
  undefined8 local_f0;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 uVar6;
  uint8_t *src0_00;
  undefined8 uStack_a8;
  
  uVar6 = 0x40;
  auVar3 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar3 = vpinsrb_avx(auVar3,0x40,2);
  auVar3 = vpinsrb_avx(auVar3,0x40,3);
  auVar3 = vpinsrb_avx(auVar3,0x40,4);
  auVar3 = vpinsrb_avx(auVar3,0x40,5);
  auVar3 = vpinsrb_avx(auVar3,0x40,6);
  auVar3 = vpinsrb_avx(auVar3,0x40,7);
  auVar3 = vpinsrb_avx(auVar3,0x40,8);
  auVar3 = vpinsrb_avx(auVar3,0x40,9);
  auVar3 = vpinsrb_avx(auVar3,0x40,10);
  auVar3 = vpinsrb_avx(auVar3,0x40,0xb);
  auVar3 = vpinsrb_avx(auVar3,0x40,0xc);
  auVar3 = vpinsrb_avx(auVar3,0x40,0xd);
  auVar3 = vpinsrb_avx(auVar3,0x40,0xe);
  auVar3 = vpinsrb_avx(auVar3,0x40,0xf);
  auVar5 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar5 = vpinsrb_avx(auVar5,0x40,2);
  auVar5 = vpinsrb_avx(auVar5,0x40,3);
  auVar5 = vpinsrb_avx(auVar5,0x40,4);
  auVar5 = vpinsrb_avx(auVar5,0x40,5);
  auVar5 = vpinsrb_avx(auVar5,0x40,6);
  auVar5 = vpinsrb_avx(auVar5,0x40,7);
  auVar5 = vpinsrb_avx(auVar5,0x40,8);
  auVar5 = vpinsrb_avx(auVar5,0x40,9);
  auVar5 = vpinsrb_avx(auVar5,0x40,10);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xb);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xc);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xd);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xe);
  auVar5 = vpinsrb_avx(auVar5,0x40,0xf);
  auVar2 = ZEXT116(0) * auVar3 + ZEXT116(1) * auVar5;
  auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar3;
  src0_00 = auVar5._0_8_;
  uStack_a8 = auVar5._8_8_;
  a = in_RSI;
  local_f0 = in_R8;
  auVar3 = auVar2;
  do {
    for (local_124 = 0; local_124 < (int)mask_stride; local_124 = local_124 + 0x20) {
      yy_loadu_256((__m256i *)(in_stack_00000008 + local_124),a);
      auVar1._16_8_ = src0_00;
      auVar1._0_16_ = auVar2;
      auVar1._24_8_ = uStack_a8;
      auVar4._16_8_ = auVar5._0_8_;
      auVar4._0_16_ = auVar3;
      auVar4._24_8_ = auVar5._8_8_;
      auVar4 = vpsubb_avx2(auVar1,auVar4);
      a = (void *)(local_f0 + local_124);
      blend_32_u8_avx2(src0_00,auVar2._8_8_,auVar2._0_8_,
                       (__m256i *)CONCAT17(uVar6,in_stack_ffffffffffffff38),
                       (int32_t)((ulong)in_RDI >> 0x20));
      local_1a0 = auVar4._0_8_;
      uStack_198 = auVar4._8_8_;
      a_00 = auVar4._16_8_;
      uStack_188 = auVar4._24_8_;
      v[1] = in_stack_fffffffffffffe40._0_8_;
      v[2] = in_stack_fffffffffffffe40._8_8_;
      v[3] = in_stack_fffffffffffffe40._16_8_;
      v[0] = 0x603a9f;
      yy_storeu_256(a_00,v);
      auVar5._8_8_ = uStack_188;
      auVar5._0_8_ = a_00;
      auVar3._8_8_ = uStack_198;
      auVar3._0_8_ = local_1a0;
    }
    in_RDI = in_RDI + ((ulong)in_RSI & 0xffffffff);
    local_f0 = local_f0 + (ulong)in_R9D;
    in_stack_00000008 = in_stack_00000008 + ((ulong)mask & 0xffffffff);
    w = w + -1;
  } while (w != 0);
  return;
}

Assistant:

static inline void blend_a64_mask_w32n_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m256i v_maxval_b = _mm256_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  do {
    int c;
    for (c = 0; c < w; c += 32) {
      const __m256i v_m0_b = yy_loadu_256(mask + c);
      const __m256i v_m1_b = _mm256_sub_epi8(v_maxval_b, v_m0_b);

      const __m256i v_res_b = blend_32_u8_avx2(
          src0 + c, src1 + c, &v_m0_b, &v_m1_b, AOM_BLEND_A64_ROUND_BITS);

      yy_storeu_256(dst + c, v_res_b);
    }
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
    mask += mask_stride;
  } while (--h);
}